

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O0

int main(int raw_argc,char **raw_argv)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  size_type sVar9;
  const_reference pvVar10;
  undefined8 uVar11;
  long lVar12;
  uint *puVar13;
  bool invalid_utf8;
  int i;
  vector<int,_std::allocator<int>_> tokens;
  bool escape;
  bool parse_special;
  bool add_bos;
  bool model_wants_add_bos;
  stringstream stdin_buffer;
  llama_context *ctx;
  llama_context_params ctx_params;
  llama_vocab *vocab;
  llama_model *model;
  llama_model_params model_params;
  bool success;
  string prompt;
  int prompts_set;
  string arg;
  int iarg;
  bool stdin_set;
  bool prompt_set;
  bool prompt_path_set;
  bool model_path_set;
  char *prompt_arg;
  char *prompt_path;
  char *model_path;
  bool show_token_count;
  bool disable_logging;
  bool no_parse_special;
  bool no_escape;
  bool no_bos;
  bool printing_ids;
  int argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffaac;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffab4;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffac0;
  llama_token in_stack_fffffffffffffac4;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  char **in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  byte local_4cb;
  undefined8 in_stack_fffffffffffffb38;
  ostream *this;
  undefined2 uVar24;
  string *in_stack_fffffffffffffb40;
  llama_vocab *vocab_00;
  string local_480 [35];
  byte local_45d;
  int local_45c;
  vector<int,_std::allocator<int>_> local_440;
  byte local_424;
  byte local_423;
  byte local_422;
  byte local_421;
  string local_420 [32];
  stringstream local_400 [16];
  ostream local_3f0 [376];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  long local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  bool *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined4 uStack_160;
  llama_token lStack_15c;
  undefined8 local_120 [8];
  undefined1 local_e0;
  string local_d8 [39];
  byte local_b1;
  string local_b0 [36];
  uint local_8c;
  string local_88 [32];
  int local_68;
  byte local_64;
  byte local_63;
  byte local_62;
  byte local_61;
  char *local_60;
  long local_58;
  long local_50;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  uint local_40;
  int local_2c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  int local_4;
  
  vocab_00 = (llama_vocab *)&stack0xfffffffffffffaa8;
  local_4 = 0;
  ingest_args_abi_cxx11_((int)((ulong)in_stack_fffffffffffffb18 >> 0x20),in_stack_fffffffffffffb10);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  local_2c = (int)sVar9;
  if (local_2c < 2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,0);
    std::__cxx11::string::c_str();
    print_usage_information((char *)0x1511bc);
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  local_41 = 0;
  local_42 = 0;
  local_43 = 0;
  local_44 = 0;
  local_45 = 0;
  local_46 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = (char *)0x0;
  local_61 = 0;
  local_62 = 0;
  local_63 = 0;
  local_64 = 0;
  for (local_68 = 1; uVar24 = (undefined2)((ulong)in_stack_fffffffffffffb38 >> 0x30),
      local_68 < local_2c; local_68 = local_68 + 1) {
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_28,(long)local_68);
    std::__cxx11::string::string(local_88,(string *)pvVar10);
    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                            (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    if ((bVar7) ||
       (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8
                                                )), bVar7)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_28,0);
      std::__cxx11::string::c_str();
      print_usage_information((char *)0x151321);
      local_4 = 0;
      local_40 = 1;
    }
    else {
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                              (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8))
      ;
      if (bVar7) {
        local_41 = 1;
      }
      else {
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8
                                                ));
        if ((bVar7) ||
           (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffaac,
                                                      in_stack_fffffffffffffaa8)), bVar7)) {
          if ((local_61 & 1) != 0) {
            fprintf(_stderr,"Error: -m or --model specified multiple times.\n");
            local_4 = 1;
            local_40 = 1;
            goto LAB_001517ce;
          }
          local_68 = local_68 + 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_28,(long)local_68);
          local_50 = std::__cxx11::string::c_str();
          local_61 = 1;
        }
        else {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                  (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                   in_stack_fffffffffffffaa8));
          if (bVar7) {
            local_42 = 1;
          }
          else {
            bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffaac,
                                                      in_stack_fffffffffffffaa8));
            if (bVar7) {
              local_43 = 1;
            }
            else {
              bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffab4,
                                                  in_stack_fffffffffffffab0),
                                      (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                       in_stack_fffffffffffffaa8));
              if (bVar7) {
                local_44 = 1;
              }
              else {
                bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffab4,
                                                    in_stack_fffffffffffffab0),
                                        (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                         in_stack_fffffffffffffaa8));
                if ((bVar7) ||
                   (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffab4,
                                                        in_stack_fffffffffffffab0),
                                            (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                             in_stack_fffffffffffffaa8)), bVar7)) {
                  if ((local_63 & 1) != 0) {
                    fprintf(_stderr,"Error: -p or --prompt specified multiple times.\n");
                    local_4 = 1;
                    local_40 = 1;
                    goto LAB_001517ce;
                  }
                  local_68 = local_68 + 1;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_28,(long)local_68);
                  local_60 = (char *)std::__cxx11::string::c_str();
                  local_63 = 1;
                }
                else {
                  bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffffab4,
                                                      in_stack_fffffffffffffab0),
                                          (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                           in_stack_fffffffffffffaa8));
                  if ((bVar7) ||
                     (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_fffffffffffffab4,
                                                          in_stack_fffffffffffffab0),
                                              (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                               in_stack_fffffffffffffaa8)), bVar7))
                  {
                    if ((local_62 & 1) != 0) {
                      fprintf(_stderr,"Error: -f or --file specified multiple times.\n");
                      local_4 = 1;
                      local_40 = 1;
                      goto LAB_001517ce;
                    }
                    local_68 = local_68 + 1;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_28,(long)local_68);
                    local_58 = std::__cxx11::string::c_str();
                    local_62 = 1;
                  }
                  else {
                    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffab4,
                                                        in_stack_fffffffffffffab0),
                                            (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                             in_stack_fffffffffffffaa8));
                    if (bVar7) {
                      local_64 = 1;
                    }
                    else {
                      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_fffffffffffffab4,
                                                          in_stack_fffffffffffffab0),
                                              (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                               in_stack_fffffffffffffaa8));
                      if (bVar7) {
                        local_45 = 1;
                      }
                      else {
                        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT44(in_stack_fffffffffffffab4,
                                                            in_stack_fffffffffffffab0),
                                                (char *)CONCAT44(in_stack_fffffffffffffaac,
                                                                 in_stack_fffffffffffffaa8));
                        __stream = _stderr;
                        if (!bVar7) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&local_28,(long)local_68);
                          uVar11 = std::__cxx11::string::c_str();
                          fprintf(__stream,"Error: unknown option \'%s\'\n",uVar11);
                          local_4 = 1;
                          local_40 = 1;
                          goto LAB_001517ce;
                        }
                        local_46 = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_40 = 0;
    }
LAB_001517ce:
    std::__cxx11::string::~string(local_88);
    if (local_40 != 0) goto LAB_001522fb;
  }
  if (((local_61 & 1) != 0) && (local_50 == 0)) {
    fprintf(_stderr,"Error: --model requires an argument.\n");
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  if ((local_61 & 1) == 0) {
    fprintf(_stderr,"Error: must specify --model.\n");
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  if (((local_62 & 1) != 0) && (local_58 == 0)) {
    fprintf(_stderr,"Error: --file requires an argument.\n");
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  if (((local_63 & 1) != 0) && (local_60 == (char *)0x0)) {
    fprintf(_stderr,"Error: --prompt requires an argument.\n");
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  local_8c = (uint)(local_62 & 1) + (uint)(local_63 & 1) + (uint)(local_64 & 1);
  if (1 < local_8c) {
    fprintf(_stderr,"Error: --stdin, --file and --prompt are mutually exclusive.\n");
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  if (local_8c == 0) {
    fprintf(_stderr,"Error: must specify one of: --stdin, --file or --prompt.\n");
    local_4 = 1;
    local_40 = 1;
    goto LAB_001522fb;
  }
  uStack_160 = in_stack_fffffffffffffac0;
  lStack_15c = in_stack_fffffffffffffac4;
  if (local_50 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,0x133,"GGML_ASSERT(%s) failed","model_path");
    uStack_160 = in_stack_fffffffffffffac0;
    lStack_15c = in_stack_fffffffffffffac4;
  }
  if (((local_58 == 0) && (local_60 == (char *)0x0)) && ((local_64 & 1) == 0)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
               ,0x134,"GGML_ASSERT(%s) failed","prompt_path || prompt_arg || stdin_set");
  }
  std::__cxx11::string::string(local_b0);
  if ((local_62 & 1) == 0) {
    if ((local_63 & 1) == 0) {
      if ((local_64 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
                   ,0x144,"GGML_ASSERT(%s) failed","stdin_set");
      }
    }
    else {
      std::__cxx11::string::operator=(local_b0,local_60);
    }
LAB_00151b3d:
    if ((local_45 & 1) != 0) {
      llama_log_set(llama_log_callback_null,0);
    }
    llama_backend_init();
    llama_model_default_params(local_120);
    local_e0 = 1;
    local_178 = local_120[0];
    uStack_160 = (undefined4)local_120[3];
    lStack_15c = (llama_token)((ulong)local_120[3] >> 0x20);
    lVar12 = llama_model_load_from_file(local_50);
    if (lVar12 == 0) {
      fprintf(_stderr,"Error: could not load model from file \'%s\'.\n",local_50);
      local_4 = 1;
      local_40 = 1;
    }
    else {
      local_180 = llama_model_get_vocab(lVar12);
      llama_context_default_params(&local_1f8);
      local_208 = local_188;
      local_218 = local_198;
      uStack_210 = uStack_190;
      local_228 = local_1a8;
      uStack_220 = uStack_1a0;
      local_238 = local_1b8;
      uStack_230 = uStack_1b0;
      local_248 = local_1c8;
      uStack_240 = uStack_1c0;
      uVar6 = uStack_240;
      local_258 = local_1d8;
      uVar5 = local_258;
      uStack_250 = uStack_1d0;
      local_268 = local_1e8;
      uVar3 = local_268;
      uStack_260 = uStack_1e0;
      uVar4 = uStack_260;
      local_278 = local_1f8;
      uVar11 = local_278;
      uStack_270 = uStack_1f0;
      uVar2 = uStack_270;
      local_278._0_4_ = (undefined4)local_1f8;
      local_278._4_4_ = (undefined4)((ulong)local_1f8 >> 0x20);
      uStack_270._0_4_ = (undefined4)uStack_1f0;
      uStack_270._4_4_ = (undefined4)((ulong)uStack_1f0 >> 0x20);
      local_268._0_4_ = (undefined4)local_1e8;
      local_268._4_4_ = (undefined4)((ulong)local_1e8 >> 0x20);
      uStack_260._0_4_ = (undefined4)uStack_1e0;
      uStack_260._4_4_ = (llama_token)((ulong)uStack_1e0 >> 0x20);
      local_258._0_4_ = (undefined4)local_1d8;
      local_258._4_4_ = (undefined4)((ulong)local_1d8 >> 0x20);
      uStack_240._0_4_ = (undefined4)uStack_1c0;
      uStack_240._4_4_ = (undefined4)((ulong)uStack_1c0 >> 0x20);
      uVar14 = (undefined4)local_278;
      uVar15 = local_278._4_4_;
      uVar16 = (undefined4)uStack_270;
      uVar17 = uStack_270._4_4_;
      uVar18 = (undefined4)local_268;
      uVar19 = local_268._4_4_;
      uStack_160 = (undefined4)uStack_260;
      lStack_15c = uStack_260._4_4_;
      uVar20 = (undefined4)local_258;
      uVar21 = local_258._4_4_;
      uVar22 = (undefined4)uStack_240;
      uVar23 = uStack_240._4_4_;
      local_278 = uVar11;
      uStack_270 = uVar2;
      local_268 = uVar3;
      uStack_260 = uVar4;
      local_258 = uVar5;
      uStack_240 = uVar6;
      local_200 = llama_init_from_model(lVar12);
      if (local_200 == 0) {
        fprintf(_stderr,"Error: could not create context.\n");
        local_4 = 1;
        local_40 = 1;
      }
      else {
        if ((local_64 & 1) != 0) {
          if (((local_62 & 1) != 0) || ((local_63 & 1) != 0)) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/tokenize/tokenize.cpp"
                       ,0x166,"GGML_ASSERT(%s) failed","!prompt_path_set && !prompt_set");
          }
          std::__cxx11::stringstream::stringstream(local_400);
          this = local_3f0;
          in_stack_fffffffffffffb40 = (string *)std::ios::rdbuf();
          std::ostream::operator<<(this,(streambuf *)in_stack_fffffffffffffb40);
          uVar24 = (undefined2)((ulong)this >> 0x30);
          bVar8 = std::ios::fail();
          bVar7 = (bVar8 & 1) != 0;
          if (bVar7) {
            fprintf(_stderr,"Error: could not read the entire standard input.\n");
            local_4 = 1;
          }
          else {
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator=(local_b0,local_420);
            std::__cxx11::string::~string(local_420);
          }
          local_40 = (uint)bVar7;
          std::__cxx11::stringstream::~stringstream(local_400);
          if (local_40 != 0) goto LAB_001522dd;
        }
        local_421 = llama_vocab_get_add_bos(local_180);
        local_421 = local_421 & 1;
        local_4cb = 0;
        if (local_421 != 0) {
          local_4cb = local_42 ^ 0xff;
        }
        local_422 = local_4cb & 1;
        local_423 = (local_44 ^ 0xff) & 1;
        local_424 = (local_43 ^ 0xff) & 1;
        if (local_424 != 0) {
          string_process_escapes((string *)CONCAT44(uVar23,uVar22));
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x15201f);
        common_tokenize(vocab_00,in_stack_fffffffffffffb40,SUB21((ushort)uVar24 >> 8,0),
                        SUB21(uVar24,0));
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_15c,uStack_160),
                   (vector<int,_std::allocator<int>_> *)CONCAT44(uVar19,uVar18));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_15c,uStack_160));
        if ((local_41 & 1) != 0) {
          printf("[");
        }
        for (local_45c = 0; iVar1 = local_45c,
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_440), iVar1 < (int)sVar9;
            local_45c = local_45c + 1) {
          if ((local_41 & 1) == 0) {
            local_45d = 0;
            puVar13 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                        (&local_440,(long)local_45c);
            printf("%6d -> \'",(ulong)*puVar13);
            std::vector<int,_std::allocator<int>_>::operator[](&local_440,(long)local_45c);
            common_token_to_piece_abi_cxx11_
                      ((llama_context *)CONCAT44(uVar21,uVar20),lStack_15c,
                       SUB41((uint)uStack_160 >> 0x18,0));
            std::__cxx11::string::c_str();
            write_utf8_cstr_to_stdout
                      ((char *)CONCAT44(uVar17,uVar16),(bool *)CONCAT44(uVar15,uVar14));
            std::__cxx11::string::~string(local_480);
            if ((local_45d & 1) == 0) {
              printf("\'\n");
            }
            else {
              printf("\' (utf-8 decode failure)\n");
            }
          }
          else {
            if (0 < local_45c) {
              printf(", ");
            }
            puVar13 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                        (&local_440,(long)local_45c);
            printf("%d",(ulong)*puVar13);
          }
        }
        if ((local_41 & 1) != 0) {
          printf("]\n");
        }
        if ((local_46 & 1) != 0) {
          sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_440);
          printf("Total number of tokens: %zu\n",sVar9);
        }
        llama_free(local_200);
        llama_model_free(lVar12);
        local_4 = 0;
        local_40 = 1;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_15c,uStack_160));
      }
    }
  }
  else {
    local_b1 = 0;
    read_prompt_from_file_abi_cxx11_(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::__cxx11::string::operator=(local_b0,local_d8);
    std::__cxx11::string::~string(local_d8);
    if ((local_b1 & 1) != 0) goto LAB_00151b3d;
    local_4 = 1;
    local_40 = 1;
  }
LAB_001522dd:
  std::__cxx11::string::~string(local_b0);
  in_stack_fffffffffffffac0 = uStack_160;
  in_stack_fffffffffffffac4 = lStack_15c;
LAB_001522fb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  return local_4;
}

Assistant:

int main(int raw_argc, char ** raw_argv) {
    const std::vector<std::string> argv = ingest_args(raw_argc, raw_argv);
    const int argc = argv.size();

    if (argc <= 1) {
        print_usage_information(argv[0].c_str());
        return 1;
    }

    //////
    // Read out all the command line arguments.
    //////

    // variables where to put any arguments we see.
    bool printing_ids = false;
    bool no_bos = false;
    bool no_escape = false;
    bool no_parse_special = false;
    bool disable_logging = false;
    bool show_token_count = false;
    const char * model_path = NULL;
    const char * prompt_path = NULL;
    const char * prompt_arg = NULL;

    // track which arguments were explicitly given
    // used for sanity checking down the line
    bool model_path_set = false;
    bool prompt_path_set = false;
    bool prompt_set = false;
    bool stdin_set = false;

    int iarg = 1;
    for (; iarg < argc; ++iarg) {
        std::string arg{argv[iarg]};
        if (arg == "-h" || arg == "--help") {
            print_usage_information(argv[0].c_str());
            return 0;
        }
        else if (arg == "--ids") {
            printing_ids = true;
        }
        else if (arg == "-m" || arg == "--model") {
            if (model_path_set) {
                fprintf(stderr, "Error: -m or --model specified multiple times.\n");
                return 1;
            }
            model_path = argv[++iarg].c_str();
            model_path_set = true;
        }
        else if (arg == "--no-bos") {
            no_bos = true;
        }
        else if (arg == "--no-escape") {
            no_escape = true;
        }
        else if (arg == "--no-parse-special") {
            no_parse_special = true;
        }
        else if (arg == "-p" || arg == "--prompt") {
            if (prompt_set) {
                fprintf(stderr, "Error: -p or --prompt specified multiple times.\n");
                return 1;
            }
            prompt_arg = argv[++iarg].c_str();
            prompt_set = true;
        }
        else if (arg == "-f" || arg == "--file") {
            if (prompt_path_set) {
                fprintf(stderr, "Error: -f or --file specified multiple times.\n");
                return 1;
            }
            prompt_path = argv[++iarg].c_str();
            prompt_path_set = true;
        }
        else if (arg == "--stdin") {
            stdin_set = true;
        }
        else if (arg == "--log-disable") {
            disable_logging = true;
        }
        else if (arg == "--show-count") {
            show_token_count = true;
        }
        else {
            fprintf(stderr, "Error: unknown option '%s'\n", argv[iarg].c_str());
            return 1;
        }
    }

    //////
    // Sanity check the command line arguments.
    //////

    // Check that we have the required stuff set.
    if (model_path_set && model_path == NULL) {
        fprintf(stderr, "Error: --model requires an argument.\n");
        return 1;
    }
    if (!model_path_set) {
        fprintf(stderr, "Error: must specify --model.\n");
        return 1;
    }
    if (prompt_path_set && prompt_path == NULL) {
        fprintf(stderr, "Error: --file requires an argument.\n");
        return 1;
    }
    if (prompt_set && prompt_arg == NULL) {
        fprintf(stderr, "Error: --prompt requires an argument.\n");
        return 1;
    }
    const int prompts_set = !!(prompt_path_set) + !!(prompt_set) + !!(stdin_set);
    if (prompts_set > 1) {
        fprintf(stderr, "Error: --stdin, --file and --prompt are mutually exclusive.\n");
        return 1;
    }
    // Must have some prompt.
    if (prompts_set == 0) {
        fprintf(stderr, "Error: must specify one of: --stdin, --file or --prompt.\n");
        return 1;
    }

    GGML_ASSERT(model_path);
    GGML_ASSERT(prompt_path || prompt_arg || stdin_set);

    //////
    // Figure out where will the prompt come from.
    //////

    std::string prompt;
    if (prompt_path_set) {
        bool success = false;
        prompt = read_prompt_from_file(prompt_path, success);
        if (!success) {
            return 1;
        }
    } else if (prompt_set) {
        prompt = prompt_arg;
    } else {
        GGML_ASSERT(stdin_set);
        // we read stdin *after* loading model (early exit if model cannot
        // be loaded, which can be a nicer user experience)
    }

    //////
    // Start actually doing the tokenizing stuff.
    //////

    if (disable_logging) {
        llama_log_set(llama_log_callback_null, NULL);
    }

    llama_backend_init();

    llama_model_params model_params = llama_model_default_params();
    model_params.vocab_only = true;
    llama_model * model = llama_model_load_from_file(model_path, model_params);
    if (!model) {
        fprintf(stderr, "Error: could not load model from file '%s'.\n", model_path);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_context_params ctx_params = llama_context_default_params();
    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (!ctx) {
        fprintf(stderr, "Error: could not create context.\n");
        return 1;
    }

    // read entire prompt from stdin?
    if (stdin_set) {
        GGML_ASSERT(!prompt_path_set && !prompt_set);

        std::stringstream stdin_buffer;
        stdin_buffer << std::cin.rdbuf();
        if (std::cin.fail()) {
            fprintf(stderr, "Error: could not read the entire standard input.\n");
            return 1;
        }

        prompt = stdin_buffer.str();
    }

    const bool model_wants_add_bos = llama_vocab_get_add_bos(vocab);
    const bool add_bos = model_wants_add_bos && !no_bos;
    const bool parse_special = !no_parse_special;
    const bool escape = !no_escape;

    if (escape) {
        string_process_escapes(prompt);
    }

    std::vector<llama_token> tokens;
    tokens = common_tokenize(vocab, prompt, add_bos, parse_special);

    if (printing_ids) {
        printf("[");
    }

    for (int i = 0; i < (int) tokens.size(); i++) {
        if (printing_ids) {
            if (i > 0) {
                printf(", ");
            }
            printf("%d", tokens[i]);
        } else {
            bool invalid_utf8 = false;
            printf("%6d -> '", tokens[i]);
            write_utf8_cstr_to_stdout(common_token_to_piece(ctx, tokens[i]).c_str(), invalid_utf8);
            if (invalid_utf8) {
                printf("' (utf-8 decode failure)\n");
            } else {
                printf("'\n");
            }
        }
    }

    if (printing_ids) {
        printf("]\n");
    }

    if (show_token_count) {
        printf("Total number of tokens: %zu\n", tokens.size());
    }
    // silence valgrind
    llama_free(ctx);
    llama_model_free(model);

    return 0;
}